

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_segment(REF_GRID ref_grid,REF_DBL *center,REF_DBL aoa,REF_DBL phi,REF_DBL h,
               REF_DBL *segment0,REF_DBL *segment1)

{
  double dVar1;
  REF_GLOB *pRVar2;
  REF_GLOB *pRVar3;
  bool bVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  REF_DBL local_c0;
  REF_DBL local_b8;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL first;
  REF_INT node;
  REF_DBL new_p [3];
  REF_DBL dx;
  REF_DBL x1;
  REF_DBL x0;
  REF_DBL x;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_DBL *segment1_local;
  REF_DBL *segment0_local;
  REF_DBL h_local;
  REF_DBL phi_local;
  REF_DBL aoa_local;
  REF_DBL *center_local;
  REF_GRID ref_grid_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  x = (REF_DBL)ref_grid->mpi;
  x1 = 1e+200;
  dx = -1e+200;
  bVar4 = true;
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ((REF_NODE)ref_mpi)->max;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    if (((-1 < ref_private_macro_code_rss) &&
        (ref_private_macro_code_rss < ((REF_NODE)ref_mpi)->max)) &&
       (-1 < ((REF_NODE)ref_mpi)->global[ref_private_macro_code_rss])) {
      if (bVar4) {
        bVar4 = false;
        x1 = ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf];
        dx = ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf];
      }
      else {
        if (((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf] <= x1) {
          local_b8 = ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf];
        }
        else {
          local_b8 = x1;
        }
        x1 = local_b8;
        if (dx < ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf] ||
            dx == ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf]) {
          local_c0 = ((REF_NODE)ref_mpi)->real[ref_private_macro_code_rss * 0xf];
        }
        else {
          local_c0 = dx;
        }
        dx = local_c0;
      }
    }
  }
  ref_node = (REF_NODE)segment1;
  segment1_local = segment0;
  segment0_local = (REF_DBL *)h;
  h_local = phi;
  phi_local = aoa;
  aoa_local = (REF_DBL)center;
  center_local = (REF_DBL *)ref_grid;
  uVar7 = ref_mpi_min((REF_MPI)x,&x1,&x0,3);
  if (uVar7 == 0) {
    uVar7 = ref_mpi_bcast((REF_MPI)x,&x0,1,3);
    if (uVar7 == 0) {
      x1 = x0;
      uVar7 = ref_mpi_max((REF_MPI)x,&dx,&x0,3);
      if (uVar7 == 0) {
        uVar7 = ref_mpi_bcast((REF_MPI)x,&x0,1,3);
        pRVar5 = segment0_local;
        if (uVar7 == 0) {
          dVar8 = x0 - x1;
          x1 = dVar8 * -0.1 + x1;
          dx = dVar8 * 0.1 + x0;
          *segment1_local = x1;
          dVar8 = *(double *)((long)aoa_local + 8);
          dVar9 = sin((h_local / 180.0) * 3.14159265358979);
          pRVar6 = segment0_local;
          segment1_local[1] = (double)pRVar5 * dVar9 + dVar8;
          dVar8 = *(double *)((long)aoa_local + 0x10);
          dVar9 = cos((h_local / 180.0) * 3.14159265358979);
          pRVar5 = segment0_local;
          segment1_local[2] = -(double)pRVar6 * dVar9 + dVar8;
          *(REF_DBL *)ref_node = dx;
          dVar8 = *(double *)((long)aoa_local + 8);
          dVar9 = sin((h_local / 180.0) * 3.14159265358979);
          pRVar6 = segment0_local;
          *(double *)&ref_node->blank = (double)pRVar5 * dVar9 + dVar8;
          dVar8 = *(double *)((long)aoa_local + 0x10);
          dVar9 = cos((h_local / 180.0) * 3.14159265358979);
          ref_node->global = (REF_GLOB *)(-(double)pRVar6 * dVar9 + dVar8);
          *segment1_local = *segment1_local - *(double *)aoa_local;
          segment1_local[1] = segment1_local[1] - *(double *)((long)aoa_local + 8);
          segment1_local[2] = segment1_local[2] - *(double *)((long)aoa_local + 0x10);
          dVar8 = *segment1_local;
          dVar10 = cos((-phi_local / 180.0) * 3.14159265358979);
          dVar9 = segment1_local[2];
          dVar11 = sin((-phi_local / 180.0) * 3.14159265358979);
          dVar1 = segment1_local[1];
          dVar14 = *segment1_local;
          dVar12 = sin((-phi_local / 180.0) * 3.14159265358979);
          dVar15 = segment1_local[2];
          dVar13 = cos((-phi_local / 180.0) * 3.14159265358979);
          *segment1_local = *(double *)aoa_local + dVar8 * dVar10 + dVar9 * dVar11;
          segment1_local[1] = *(double *)((long)aoa_local + 8) + dVar1;
          segment1_local[2] =
               *(double *)((long)aoa_local + 0x10) + -dVar14 * dVar12 + dVar15 * dVar13;
          *(double *)ref_node = *(double *)ref_node - *(double *)aoa_local;
          *(double *)&ref_node->blank =
               *(double *)&ref_node->blank - *(double *)((long)aoa_local + 8);
          ref_node->global =
               (REF_GLOB *)((double)ref_node->global - *(double *)((long)aoa_local + 0x10));
          dVar8 = *(double *)ref_node;
          dVar14 = cos((-phi_local / 180.0) * 3.14159265358979);
          pRVar2 = ref_node->global;
          dVar15 = sin((-phi_local / 180.0) * 3.14159265358979);
          dVar9 = *(double *)&ref_node->blank;
          dVar1 = *(double *)ref_node;
          dVar10 = sin((-phi_local / 180.0) * 3.14159265358979);
          pRVar3 = ref_node->global;
          dVar11 = cos((-phi_local / 180.0) * 3.14159265358979);
          *(double *)ref_node = *(double *)aoa_local + dVar8 * dVar14 + (double)pRVar2 * dVar15;
          *(double *)&ref_node->blank = *(double *)((long)aoa_local + 8) + dVar9;
          ref_node->global =
               (REF_GLOB *)
               (*(double *)((long)aoa_local + 0x10) + -dVar1 * dVar10 + (double)pRVar3 * dVar11);
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x2ec,"ref_iso_segment",(ulong)uVar7,"bcast max");
          ref_grid_local._4_4_ = uVar7;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2eb
               ,"ref_iso_segment",(ulong)uVar7,"mpi max");
        ref_grid_local._4_4_ = uVar7;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2e9,
             "ref_iso_segment",(ulong)uVar7,"bcast min");
      ref_grid_local._4_4_ = uVar7;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2e8,
           "ref_iso_segment",(ulong)uVar7,"mpi min");
    ref_grid_local._4_4_ = uVar7;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment(REF_GRID ref_grid, REF_DBL *center,
                                   REF_DBL aoa, REF_DBL phi, REF_DBL h,
                                   REF_DBL *segment0, REF_DBL *segment1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL x, x0, x1, dx;
  REF_DBL new_p[3];
  REF_INT node;
  REF_BOOL first;
  x0 = REF_DBL_MAX;
  x1 = REF_DBL_MIN;
  first = REF_TRUE;
  each_ref_node_valid_node(ref_node, node) {
    if (first) {
      first = REF_FALSE;
      x0 = ref_node_xyz(ref_node, 0, node);
      x1 = ref_node_xyz(ref_node, 0, node);
    } else {
      x0 = MIN(x0, ref_node_xyz(ref_node, 0, node));
      x1 = MAX(x1, ref_node_xyz(ref_node, 0, node));
    }
  }
  RSS(ref_mpi_min(ref_mpi, &x0, &x, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast min");
  x0 = x;
  RSS(ref_mpi_max(ref_mpi, &x1, &x, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &x, 1, REF_DBL_TYPE), "bcast max");
  x1 = x;

  dx = x1 - x0;
  x0 -= 0.1 * dx;
  x1 += 0.1 * dx;

  segment0[0] = x0;
  segment0[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment0[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment1[0] = x1;
  segment1[1] = center[1] + h * sin(ref_math_in_radians(phi));
  segment1[2] = center[2] - h * cos(ref_math_in_radians(phi));

  segment0[0] -= center[0];
  segment0[1] -= center[1];
  segment0[2] -= center[2];
  new_p[0] = segment0[0] * cos(ref_math_in_radians(-aoa)) +
             segment0[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment0[1];
  new_p[2] = -segment0[0] * sin(ref_math_in_radians(-aoa)) +
             segment0[2] * cos(ref_math_in_radians(-aoa));
  segment0[0] = center[0] + new_p[0];
  segment0[1] = center[1] + new_p[1];
  segment0[2] = center[2] + new_p[2];

  segment1[0] -= center[0];
  segment1[1] -= center[1];
  segment1[2] -= center[2];
  new_p[0] = segment1[0] * cos(ref_math_in_radians(-aoa)) +
             segment1[2] * sin(ref_math_in_radians(-aoa));
  new_p[1] = segment1[1];
  new_p[2] = -segment1[0] * sin(ref_math_in_radians(-aoa)) +
             segment1[2] * cos(ref_math_in_radians(-aoa));
  segment1[0] = center[0] + new_p[0];
  segment1[1] = center[1] + new_p[1];
  segment1[2] = center[2] + new_p[2];

  return REF_SUCCESS;
}